

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
          (CopyingInputStreamAdaptor *this,CopyingInputStream *copying_stream,int block_size)

{
  int in_EDX;
  _func_int **in_RSI;
  ZeroCopyInputStream *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  ZeroCopyInputStream::ZeroCopyInputStream(in_RDI);
  in_RDI->_vptr_ZeroCopyInputStream = (_func_int **)&PTR__CopyingInputStreamAdaptor_006f0c48;
  in_RDI[1]._vptr_ZeroCopyInputStream = in_RSI;
  *(undefined1 *)&in_RDI[2]._vptr_ZeroCopyInputStream = 0;
  *(undefined1 *)((long)&in_RDI[2]._vptr_ZeroCopyInputStream + 1) = 0;
  in_RDI[3]._vptr_ZeroCopyInputStream = (_func_int **)0x0;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_EDX < 1) {
    in_EDX = 0x2000;
  }
  *(int *)&in_RDI[5]._vptr_ZeroCopyInputStream = in_EDX;
  *(undefined4 *)((long)&in_RDI[5]._vptr_ZeroCopyInputStream + 4) = 0;
  *(undefined4 *)&in_RDI[6]._vptr_ZeroCopyInputStream = 0;
  return;
}

Assistant:

CopyingInputStreamAdaptor::CopyingInputStreamAdaptor(
    CopyingInputStream* copying_stream, int block_size)
    : copying_stream_(copying_stream),
      owns_copying_stream_(false),
      failed_(false),
      position_(0),
      buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
      buffer_used_(0),
      backup_bytes_(0) {}